

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O1

bool glcts::verifyImage<unsigned_int,1u>
               (GLuint image_width,GLuint image_height,uint *components,uint *image)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  bVar6 = image_height == 0;
  if (!bVar6) {
    uVar4 = 0;
    do {
      if (image_width != 0) {
        uVar5 = 0;
        do {
          bVar2 = true;
          do {
            bVar1 = bVar2;
            if (!bVar1) {
              iVar3 = 0;
              goto LAB_00d66292;
            }
            bVar2 = false;
          } while (image[uVar4 * image_width + (int)uVar5] == *components);
          iVar3 = 1;
LAB_00d66292:
          if (bVar1) goto LAB_00d662a5;
          uVar5 = uVar5 + 1;
        } while (uVar5 != image_width);
      }
      iVar3 = 5;
LAB_00d662a5:
      if ((iVar3 != 5) && (iVar3 != 0)) {
        return bVar6;
      }
      uVar4 = uVar4 + 1;
      bVar6 = image_height <= uVar4;
    } while (uVar4 != image_height);
  }
  return bVar6;
}

Assistant:

bool verifyImage(glw::GLuint image_width, glw::GLuint image_height, const T* components, const T* image)
{
	const glw::GLuint line_size = image_width * N_Components;

	for (glw::GLuint y = 0; y < image_height; ++y)
	{
		const glw::GLuint line_offset = y * line_size;

		for (glw::GLuint x = 0; x < image_width; ++x)
		{
			const glw::GLuint pixel_offset = line_offset + x * N_Components;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (image[pixel_offset + component] != components[component])
				{
					return false;
				}
			} /* for (all components) */
		}	 /* for (all columns) */
	}		  /* for (all rows) */

	return true;
}